

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O0

int __thiscall HttpRequest::buildFirstLine(HttpRequest *this)

{
  int iVar1;
  string *psVar2;
  ulong uVar3;
  HttpRequest *this_local;
  
  std::__cxx11::string::operator=
            ((string *)&(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr,
             gMethodTypeList[this->mMethod]);
  std::__cxx11::string::operator+=
            ((string *)&(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr," ");
  psVar2 = URI::getPath_abi_cxx11_(&this->mUri);
  std::__cxx11::string::operator+=
            ((string *)&(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr,(string *)psVar2);
  URI::getQuery_abi_cxx11_(&this->mUri);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=
              ((string *)&(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr,"?");
    psVar2 = URI::getQuery_abi_cxx11_(&this->mUri);
    std::__cxx11::string::operator+=
              ((string *)&(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr,(string *)psVar2)
    ;
  }
  std::__cxx11::string::operator+=
            ((string *)&(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr," HTTP/1.1\r\n");
  iVar1 = std::__cxx11::string::size();
  return iVar1;
}

Assistant:

int HttpRequest::buildFirstLine() const
{
	mHeaderStr = gMethodTypeList[ mMethod ]; 

	mHeaderStr += " ";
	mHeaderStr += mUri.getPath();

	if (not mUri.getQuery().empty())
	{
		mHeaderStr += "?";
		mHeaderStr += mUri.getQuery();
	}

	mHeaderStr += " HTTP/1.1\r\n";

	return mHeaderStr.size();
}